

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall boost::filesystem::path::root_directory(path *__return_storage_ptr__,path *this)

{
  size_type sVar1;
  long lVar2;
  long lVar3;
  size_type pos;
  path *this_local;
  
  sVar1 = std::__cxx11::string::size();
  sVar1 = anon_unknown.dwarf_f716::root_directory_start(&this->m_pathname,sVar1);
  if (sVar1 == 0xffffffffffffffff) {
    path(__return_storage_ptr__);
  }
  else {
    lVar2 = std::__cxx11::string::c_str();
    lVar3 = std::__cxx11::string::c_str();
    path<char_const*>(__return_storage_ptr__,(char *)(lVar2 + sVar1),(char *)(lVar3 + sVar1 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

path path::root_directory() const
  {
    size_type pos(root_directory_start(m_pathname, m_pathname.size()));

    return pos == string_type::npos
      ? path()
      : path(m_pathname.c_str() + pos, m_pathname.c_str() + pos + 1);
  }